

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O0

EnumDescriptorProto *
google::protobuf::DynamicCastToGenerated<google::protobuf::EnumDescriptorProto>(Message *from)

{
  long in_RDI;
  Message *unused;
  _func_EnumDescriptorProto_ptr *get_default_instance;
  EnumDescriptorProto *local_28;
  
  if (in_RDI == 0) {
    local_28 = (EnumDescriptorProto *)0x0;
  }
  else {
    local_28 = (EnumDescriptorProto *)
               __dynamic_cast(in_RDI,&Message::typeinfo,&EnumDescriptorProto::typeinfo,0);
  }
  return local_28;
}

Assistant:

const T* DynamicCastToGenerated(const Message* from) {
  // Compile-time assert that T is a generated type that has a
  // default_instance() accessor, but avoid actually calling it.
  const T& (*get_default_instance)() = &T::default_instance;
  (void)get_default_instance;

  // Compile-time assert that T is a subclass of google::protobuf::Message.
  const Message* unused = static_cast<T*>(nullptr);
  (void)unused;

#ifdef GOOGLE_PROTOBUF_NO_RTTI
  bool ok = T::default_instance().GetReflection() == from->GetReflection();
  return ok ? down_cast<const T*>(from) : nullptr;
#else
  return dynamic_cast<const T*>(from);
#endif
}